

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_tonumber(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  TValue local_38;
  TValue tmp;
  TRef base;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_10;
  
  tmp.field_4.it = *J->base;
  tmp.field_4.i = J->base[1];
  _base = rd;
  rd_local = (RecordFFData *)J;
  if (((tmp.field_4.it == 0) || ((tmp.u32.lo & 0x1f000000) == 0)) ||
     ((tmp.u32.lo = lj_opt_narrow_toint(J,tmp.u32.lo), (tmp.u32.lo & 0xffff) < 0x8000 &&
      (*(int *)(rd_local[1].nres + (ulong)(tmp.u32.lo & 0xffff) * 8) == 10)))) {
    if (((tmp.field_4.it >> 0x18 & 0x1f) - 0xe < 6) || ((tmp.field_4.it & 0x1f000000) == 0x4000000))
    {
      if ((tmp.field_4.it & 0x1f000000) == 0x4000000) {
        iVar1 = lj_strscan_num((GCstr *)(_base->argv->u64 & 0x7fffffffffff),&local_38);
        if (iVar1 == 0) {
          recff_nyi((jit_State *)rd_local,_base);
          return;
        }
        local_10 = rd_local;
        J_local._6_2_ = 0x5e8e;
        J_local._4_2_ = (undefined2)tmp.field_4.it;
        J_local._2_2_ = 0;
        *(undefined2 *)&rd_local[7].field_0x14 = 0x5e8e;
        *(undefined2 *)&rd_local[7].data = J_local._4_2_;
        *(undefined2 *)((long)&rd_local[7].data + 2) = 0;
        tmp.field_4.it = lj_opt_fold((jit_State *)rd_local);
      }
    }
    else {
      if ((tmp.field_4.it & 0x1f000000) == 0xa000000) {
        lj_crecord_tonumber((jit_State *)rd_local,_base);
        return;
      }
      tmp.field_4.it = 0x7fff;
    }
    **(uint32_t **)&rd_local[6].data = tmp.field_4.it;
  }
  else {
    recff_nyi((jit_State *)rd_local,_base);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_tonumber(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef base = J->base[1];
  if (tr && !tref_isnil(base)) {
    base = lj_opt_narrow_toint(J, base);
    if (!tref_isk(base) || IR(tref_ref(base))->i != 10) {
      recff_nyiu(J, rd);
      return;
    }
  }
  if (tref_isnumber_str(tr)) {
    if (tref_isstr(tr)) {
      TValue tmp;
      if (!lj_strscan_num(strV(&rd->argv[0]), &tmp)) {
	recff_nyiu(J, rd);  /* Would need an inverted STRTO for this case. */
	return;
      }
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    }
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    lj_crecord_tonumber(J, rd);
    return;
#endif
  } else {
    tr = TREF_NIL;
  }
  J->base[0] = tr;
  UNUSED(rd);
}